

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>
                  *this,vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
                        *list)

{
  pointer pUVar1;
  pointer data;
  UtxoObject object;
  UtxoObject UStack_1a8;
  
  pUVar1 = (list->
           super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pUVar1; data = data + 1) {
    js::api::json::UtxoObject::UtxoObject(&UStack_1a8);
    js::api::json::UtxoObject::ConvertFromStruct(&UStack_1a8,data);
    std::vector<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>::
    push_back(&(this->super_JsonVector<cfd::js::api::json::UtxoObject>).
               super_vector<cfd::js::api::json::UtxoObject,_std::allocator<cfd::js::api::json::UtxoObject>_>
              ,&UStack_1a8);
    js::api::json::UtxoObject::~UtxoObject(&UStack_1a8);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }